

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O3

void __thiscall
Imath_2_5::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  Plane3<float> frustumPlanes [6];
  Plane3<float> local_78;
  float afStack_68 [20];
  
  Frustum<float>::planes(frustum,&local_78,cameraMat);
  lVar10 = 0;
  bVar8 = true;
  do {
    bVar9 = bVar8;
    fVar1 = (&local_78)[lVar10 * 3].normal.x;
    fVar2 = afStack_68[lVar10 * 0xc];
    fVar18 = afStack_68[lVar10 * 0xc + 4];
    this->planeNormX[lVar10].x = fVar1;
    this->planeNormX[lVar10].y = fVar2;
    this->planeNormX[lVar10].z = fVar18;
    fVar3 = afStack_68[lVar10 * 0xc + -3];
    fVar4 = afStack_68[lVar10 * 0xc + 1];
    fVar14 = afStack_68[lVar10 * 0xc + 5];
    this->planeNormY[lVar10].x = fVar3;
    this->planeNormY[lVar10].y = fVar4;
    this->planeNormY[lVar10].z = fVar14;
    fVar5 = afStack_68[lVar10 * 0xc + -2];
    fVar6 = afStack_68[lVar10 * 0xc + 2];
    fVar12 = afStack_68[lVar10 * 0xc + 6];
    this->planeNormZ[lVar10].x = fVar5;
    this->planeNormZ[lVar10].y = fVar6;
    this->planeNormZ[lVar10].z = fVar12;
    if (fVar18 <= -fVar18) {
      fVar18 = -fVar18;
    }
    auVar15._4_4_ = fVar2;
    auVar15._0_4_ = fVar1;
    auVar15._8_8_ = 0;
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = CONCAT44(fVar2,fVar1) ^ 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar16 = maxps(auVar15,auVar16);
    this->planeNormAbsX[lVar10].x = (float)(int)auVar16._0_8_;
    this->planeNormAbsX[lVar10].y = (float)(int)((ulong)auVar16._0_8_ >> 0x20);
    this->planeNormAbsX[lVar10].z = fVar18;
    if (fVar14 <= -fVar14) {
      fVar14 = -fVar14;
    }
    auVar13._4_4_ = fVar4;
    auVar13._0_4_ = fVar3;
    auVar13._8_8_ = 0;
    auVar17._0_8_ = CONCAT44(fVar4,fVar3) ^ 0x8000000080000000;
    auVar17._8_4_ = 0x80000000;
    auVar17._12_4_ = 0x80000000;
    auVar16 = maxps(auVar13,auVar17);
    this->planeNormAbsY[lVar10].x = (float)(int)auVar16._0_8_;
    this->planeNormAbsY[lVar10].y = (float)(int)((ulong)auVar16._0_8_ >> 0x20);
    this->planeNormAbsY[lVar10].z = fVar14;
    if (fVar12 <= -fVar12) {
      fVar12 = -fVar12;
    }
    auVar11._4_4_ = fVar6;
    auVar11._0_4_ = fVar5;
    auVar11._8_8_ = 0;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = CONCAT44(fVar6,fVar5) ^ 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar16 = maxps(auVar11,auVar7);
    this->planeNormAbsZ[lVar10].x = (float)(int)auVar16._0_8_;
    this->planeNormAbsZ[lVar10].y = (float)(int)((ulong)auVar16._0_8_ >> 0x20);
    this->planeNormAbsZ[lVar10].z = fVar12;
    fVar1 = afStack_68[lVar10 * 0xc + 3];
    fVar2 = afStack_68[lVar10 * 0xc + 7];
    this->planeOffsetVec[lVar10].x = afStack_68[lVar10 * 0xc + -1];
    this->planeOffsetVec[lVar10].y = fVar1;
    this->planeOffsetVec[lVar10].z = fVar2;
    lVar10 = 1;
    bVar8 = false;
  } while (bVar9);
  fVar1 = frustum->_farPlane;
  fVar2 = frustum->_left;
  fVar18 = frustum->_right;
  (this->currFrustum)._nearPlane = frustum->_nearPlane;
  (this->currFrustum)._farPlane = fVar1;
  (this->currFrustum)._left = fVar2;
  (this->currFrustum)._right = fVar18;
  fVar1 = frustum->_bottom;
  (this->currFrustum)._top = frustum->_top;
  (this->currFrustum)._bottom = fVar1;
  (this->currFrustum)._orthographic = frustum->_orthographic;
  (this->cameraMatrix).x[0][0] = cameraMat->x[0][0];
  (this->cameraMatrix).x[0][1] = cameraMat->x[0][1];
  (this->cameraMatrix).x[0][2] = cameraMat->x[0][2];
  (this->cameraMatrix).x[0][3] = cameraMat->x[0][3];
  (this->cameraMatrix).x[1][0] = cameraMat->x[1][0];
  (this->cameraMatrix).x[1][1] = cameraMat->x[1][1];
  (this->cameraMatrix).x[1][2] = cameraMat->x[1][2];
  (this->cameraMatrix).x[1][3] = cameraMat->x[1][3];
  (this->cameraMatrix).x[2][0] = cameraMat->x[2][0];
  (this->cameraMatrix).x[2][1] = cameraMat->x[2][1];
  (this->cameraMatrix).x[2][2] = cameraMat->x[2][2];
  (this->cameraMatrix).x[2][3] = cameraMat->x[2][3];
  (this->cameraMatrix).x[3][0] = cameraMat->x[3][0];
  (this->cameraMatrix).x[3][1] = cameraMat->x[3][1];
  (this->cameraMatrix).x[3][2] = cameraMat->x[3][2];
  (this->cameraMatrix).x[3][3] = cameraMat->x[3][3];
  return;
}

Assistant:

void FrustumTest<T>::setFrustum(const Frustum<T> &frustum,
                                const Matrix44<T> &cameraMat)
{
    Plane3<T> frustumPlanes[6];
    frustum.planes(frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i]     = Vec3<T>(frustumPlanes[index + 0].normal.x,
                                    frustumPlanes[index + 1].normal.x, 
                                    frustumPlanes[index + 2].normal.x);
        planeNormY[i]     = Vec3<T>(frustumPlanes[index + 0].normal.y,
                                    frustumPlanes[index + 1].normal.y,
                                    frustumPlanes[index + 2].normal.y);
        planeNormZ[i]     = Vec3<T>(frustumPlanes[index + 0].normal.z,
                                    frustumPlanes[index + 1].normal.z,
                                    frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].x),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].y), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].z));
        planeNormAbsY[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].z));
        planeNormAbsZ[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T>(frustumPlanes[index + 0].distance,
                                    frustumPlanes[index + 1].distance,
                                    frustumPlanes[index + 2].distance);
    }
    currFrustum = frustum;
    cameraMatrix = cameraMat;
}